

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void UnixVfs_TempDir(jx9_context *pCtx)

{
  int iVar1;
  char *__name;
  long lVar2;
  stat buf;
  
  __name = getenv("TMPDIR");
  if ((__name != (char *)0x0) && (*__name != '\0')) {
    iVar1 = access(__name,7);
    if (iVar1 == 0) {
      iVar1 = -1;
      goto LAB_00138779;
    }
  }
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 8) {
    __name = *(char **)((long)UnixVfs_TempDir::azDirs + lVar2);
    iVar1 = stat(__name,(stat *)&buf);
    if ((iVar1 == 0) && ((buf.st_mode & 0xf000) == 0x4000)) {
      iVar1 = access(__name,7);
      if (iVar1 == 0) {
        iVar1 = -1;
        goto LAB_00138779;
      }
    }
  }
  __name = "/tmp";
  iVar1 = 4;
LAB_00138779:
  jx9_result_string(pCtx,__name,iVar1);
  return;
}

Assistant:

static void UnixVfs_TempDir(jx9_context *pCtx)
{
	static const char *azDirs[] = {
     "/var/tmp", 
     "/usr/tmp", 
	 "/usr/local/tmp"
  };
  unsigned int i;
  struct stat buf;
  const char *zDir;
  zDir = getenv("TMPDIR");
  if( zDir && zDir[0] != 0 && !access(zDir, 07) ){
	  jx9_result_string(pCtx, zDir, -1);
	  return;
  }
  for(i=0; i<sizeof(azDirs)/sizeof(azDirs[0]); i++){
	zDir=azDirs[i];
    if( zDir==0 ) continue;
    if( stat(zDir, &buf) ) continue;
    if( !S_ISDIR(buf.st_mode) ) continue;
    if( access(zDir, 07) ) continue;
    /* Got one */
	jx9_result_string(pCtx, zDir, -1);
	return;
  }
  /* Default temp dir */
  jx9_result_string(pCtx, "/tmp", (int)sizeof("/tmp")-1);
}